

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O1

void SendTimestepEntryToSingleReader
               (SstStream Stream,CPTimestepList Entry,WS_ReaderInfo CP_WSR_Stream,int rank)

{
  undefined4 uVar1;
  undefined4 uVar2;
  SstPreloadModeType SVar3;
  ssize_t sVar4;
  _SentTimestepRec *p_Var5;
  CP_DP_PerReaderTimestepRegFunc p_Var6;
  undefined8 in_RAX;
  size_t sVar7;
  _SentTimestepRec *p_Var8;
  long lVar9;
  _SentTimestepRec **pp_Var10;
  SstPreloadModeType SVar11;
  _SentTimestepRec *p_Var12;
  FFSFormatList tmp;
  FFSFormatBlock *pFVar13;
  undefined4 uVar15;
  undefined8 uVar14;
  
  uVar15 = (undefined4)((ulong)in_RAX >> 0x20);
  if (CP_WSR_Stream->ReaderStatus == Established) {
    sVar7 = CP_WSR_Stream->FormatSentCount;
    sVar4 = Entry->Timestep;
    CP_WSR_Stream->LastSentTimestep = sVar4;
    pFVar13 = Stream->PreviousFormats;
    if (sVar7 != 0 && pFVar13 != (FFSFormatList)0x0) {
      do {
        sVar7 = sVar7 - 1;
        pFVar13 = pFVar13->Next;
        if (pFVar13 == (FFSFormatBlock *)0x0) break;
      } while (sVar7 != 0);
    }
    Entry->Msg->Formats = pFVar13;
    if (rank != -1) {
      CP_verbose(Stream,PerRankVerbose,"Sent timestep %zd to reader cohort %d\n",sVar4,
                 (ulong)(uint)rank);
    }
    uVar1 = Entry->MetaDataSendCount;
    uVar2 = Entry->ReferenceCount;
    Entry->MetaDataSendCount = uVar1 + 1;
    Entry->ReferenceCount = uVar2 + 1;
    uVar14 = CONCAT44(uVar15,uVar2 + 1);
    CP_verbose(Stream,PerRankVerbose,
               "ADDING timestep %zd to sent list for reader cohort %d, READER %p, reference count is now %d\n"
               ,Entry->Timestep,(ulong)(uint)rank,CP_WSR_Stream,uVar14);
    lVar9 = Entry->Timestep;
    p_Var8 = (_SentTimestepRec *)malloc(0x10);
    p_Var5 = CP_WSR_Stream->SentTimestepList;
    p_Var8->Timestep = lVar9;
    p_Var8->Next = (_SentTimestepRec *)0x0;
    if (p_Var5 == (_SentTimestepRec *)0x0) {
      pp_Var10 = &CP_WSR_Stream->SentTimestepList;
    }
    else {
      do {
        p_Var12 = p_Var5;
        p_Var5 = p_Var12->Next;
      } while (p_Var5 != (_SentTimestepRec *)0x0);
      pp_Var10 = &p_Var12->Next;
    }
    *pp_Var10 = p_Var8;
    SVar11 = SstPreloadNone;
    if ((CP_WSR_Stream->PreloadModeActiveTimestep <= lVar9) &&
       (SVar3 = CP_WSR_Stream->PreloadMode, SVar11 = SstPreloadNone, SVar3 != SstPreloadNone)) {
      CP_verbose(Stream,PerStepVerbose,
                 "PRELOADMODE for timestep %zd non-default for reader , active at timestep %zd, mode %d\n"
                 ,lVar9,CP_WSR_Stream->PreloadModeActiveTimestep,(ulong)SVar3,uVar14);
      SVar11 = SVar3;
    }
    Entry->Msg->PreloadMode = SVar11;
    lVar9 = 0;
    for (; pFVar13 != (FFSFormatList)0x0; pFVar13 = pFVar13->Next) {
      lVar9 = lVar9 + 1;
    }
    CP_WSR_Stream->FormatSentCount = CP_WSR_Stream->FormatSentCount + lVar9;
    pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
    p_Var6 = Stream->DP_Interface->readerRegisterTimestep;
    if (p_Var6 != (CP_DP_PerReaderTimestepRegFunc)0x0) {
      (*p_Var6)(&Svcs,CP_WSR_Stream->DP_WSR_Stream,Entry->Timestep,SVar11);
    }
    pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
    if (CP_WSR_Stream->ReaderStatus == Established) {
      sendOneToWSRCohort(CP_WSR_Stream,Stream->CPInfo->SharedCM->DeliverTimestepMetadataFormat,
                         Entry->Msg,&Entry->Msg->RS_Stream);
      return;
    }
  }
  return;
}

Assistant:

static void SendTimestepEntryToSingleReader(SstStream Stream, CPTimestepList Entry,
                                            WS_ReaderInfo CP_WSR_Stream, int rank)
{
    STREAM_ASSERT_LOCKED(Stream);
    if (CP_WSR_Stream->ReaderStatus == Established)
    {
        size_t PriorSent = CP_WSR_Stream->FormatSentCount;
        CP_WSR_Stream->LastSentTimestep = Entry->Timestep;
        FFSFormatList ToSend = ReturnNthListEntry(Stream->PreviousFormats, PriorSent);
        Entry->Msg->Formats = ToSend;

        if (rank != -1)
        {
            CP_verbose(Stream, PerRankVerbose, "Sent timestep %zd to reader cohort %d\n",
                       Entry->Timestep, rank);
        }
        Entry->ReferenceCount++;
        Entry->MetaDataSendCount++;
        CP_verbose(Stream, PerRankVerbose,
                   "ADDING timestep %zd to sent list for reader cohort %d, "
                   "READER %p, reference count is now %d\n",
                   Entry->Timestep, rank, CP_WSR_Stream, Entry->ReferenceCount);
        AddTSToSentList(Stream, CP_WSR_Stream, Entry->Timestep);
        SstPreloadModeType PMode = SstPreloadNone;

        if ((Entry->Timestep >= CP_WSR_Stream->PreloadModeActiveTimestep) &&
            (CP_WSR_Stream->PreloadMode != SstPreloadNone))
        {
            PMode = CP_WSR_Stream->PreloadMode;
            CP_verbose(Stream, PerStepVerbose,
                       "PRELOADMODE for timestep %zd non-default for reader , "
                       "active at timestep %zd, mode %d\n",
                       Entry->Timestep, CP_WSR_Stream->PreloadModeActiveTimestep, PMode);
        }
        Entry->Msg->PreloadMode = PMode;
        CP_WSR_Stream->FormatSentCount += FormatListCount(ToSend);
        STREAM_MUTEX_UNLOCK(Stream);
        if (Stream->DP_Interface->readerRegisterTimestep)
        {
            (Stream->DP_Interface->readerRegisterTimestep)(&Svcs, CP_WSR_Stream->DP_WSR_Stream,
                                                           Entry->Timestep, PMode);
        }

        STREAM_MUTEX_LOCK(Stream);
        if (CP_WSR_Stream->ReaderStatus == Established)
            sendOneToWSRCohort(CP_WSR_Stream,
                               Stream->CPInfo->SharedCM->DeliverTimestepMetadataFormat, Entry->Msg,
                               &Entry->Msg->RS_Stream);
    }
}